

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O1

json_object * __thiscall
json_deserializer::deserialize(json_object *__return_storage_ptr__,json_deserializer *this)

{
  _Rb_tree_header *p_Var1;
  char ch;
  bool bVar2;
  ostream *poVar3;
  
  ch = (this->reader).cbuf._M_dataplus._M_p[(this->reader).index];
  bVar2 = is_opener(this,ch);
  if (bVar2 && ch == '{') {
    deserialize_json_object(__return_storage_ptr__,this);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Root tag was not a compound tag",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    poVar3 = (ostream *)std::ostream::flush();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(this->reader).cbuf._M_dataplus._M_p,
                        (this->reader).cbuf._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    (__return_storage_ptr__->super_json_element)._vptr_json_element = (_func_int **)0x0;
    *(undefined8 *)&(__return_storage_ptr__->map)._M_t._M_impl = 0;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    *(undefined8 *)&(__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &(__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->super_json_element)._vptr_json_element =
         (_func_int **)&PTR_get_type_0012da90;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(__return_storage_ptr__->map)._M_t._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

json_object deserialize() {
        char current = reader.current();
        if (is_opener(current) && current == opening_object) {
            return deserialize_json_object();
        }
        cerr << "Root tag was not a compound tag" << endl << reader.cbuf << endl;
        return json_object();
    }